

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::operator!=(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double *pdVar4;
  byte in_AL;
  long lVar5;
  bool bVar6;
  double *y;
  
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)this->m_xform[0] + lVar5);
    lVar5 = lVar5 + 8;
    dVar2 = *(double *)rhs;
    rhs = (ON_Xform *)((long)rhs + 8);
    bVar6 = false;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      lVar3 = lVar5;
      pdVar4 = (double *)rhs;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        do {
          rhs = (ON_Xform *)pdVar4;
          lVar5 = lVar3;
          bVar6 = true;
          in_AL = 0x7f < lVar5;
          if (0x7f < lVar5) goto LAB_00687405;
          if (NAN(*(double *)((long)this->m_xform[0] + lVar5))) break;
          lVar3 = lVar5 + 8;
          pdVar4 = (double *)((long)rhs + 8);
        } while (!NAN(*(double *)rhs));
        lVar5 = lVar5 + 8;
        rhs = (ON_Xform *)((long)rhs + 8);
      }
      else {
        bVar6 = false;
      }
    }
LAB_00687405:
    if (bVar6) goto LAB_00687415;
  } while (lVar5 < 0x80);
  in_AL = 0;
LAB_00687415:
  return (bool)(in_AL & 1);
}

Assistant:

bool ON_Xform::operator!=(const ON_Xform& rhs) const
{
  // Intentionally returns false if any coefficient is a nan.
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  const double* y = &rhs.m_xform[0][0];
  while (x < x16)
  {
    double a = *x++;
    double b = *y++;
    if (a == b)
      continue;
    if (a != b)
    {
      while (x < x16)
      {
        a = *x++;
        b = *y++;
        if (a == a && b == b)
          continue;
        return false; // a or b is a nan.
      }
      return true;  // no nans and at least one not equal equalcoefficient.
    }
  }
  return false; // nans or equal
}